

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser_xmlComments_Test::TestBody(Parser_xmlComments_Test *this)

{
  char *pcVar1;
  unsigned_long local_70;
  unsigned_long local_68;
  AssertionResult gtest_ar;
  ParserPtr parser;
  string local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  string in;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<!-- THIS COMMENT SHOULD BE IGNORED 0 -->\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n  <!-- THIS COMMENT SHOULD BE IGNORED 1 -->\n  <units name=\"fahrenheitish\">\n    <!-- THIS COMMENT SHOULD BE IGNORED 2 -->\n    <unit units=\"kelvin\"><!-- THIS COMMENT SHOULD BE IGNORED 2a --></unit>\n  </units>\n  <component name=\"main\">\n    <!-- THIS COMMENT SHOULD BE IGNORED 3 -->\n    <variable name=\"stan\" units=\"dimensionless\"/>\n    <variable name=\"V_k\" units=\"dimensionless\"><!-- THIS COMMENT SHOULD BE IGNORED 3a --></variable>\n    <reset variable=\"V_k\" order=\"2\" id=\"rid\" test_variable=\"stan\">\n      <!-- THIS COMMENT SHOULD BE IGNORED 4 -->\n      <test_value>\n        <!-- THIS COMMENT SHOULD BE IGNORED 5 -->\n        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n          <apply />\n        </math>\n      </test_value>\n      <reset_value>\n        <!-- THIS COMMENT SHOULD BE IGNORED 6 -->\n        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n          <apply />\n        </math>\n      </reset_value>\n    </reset>\n  </component>\n  <component name=\"child\"/>\n  <encapsulation>\n    <!-- THIS COMMENT SHOULD BE IGNORED 7 -->\n    <component_ref component=\"main\">\n       <!-- THIS COMMENT SHOULD BE IGNORED 8 -->\n       <component_ref component=\"child\"/>\n    </component_ref>\n  </encapsulation>\n</model>\n"
             ,(allocator<char> *)&parser);
  libcellml::Parser::create(SUB81(&parser,0));
  libcellml::Parser::parseModel(local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  local_70 = 0;
  local_68 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(0)","parser->issueCount()",&local_70,&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
               ,0x878,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&in);
  return;
}

Assistant:

TEST(Parser, xmlComments)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<!-- THIS COMMENT SHOULD BE IGNORED 0 -->\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <!-- THIS COMMENT SHOULD BE IGNORED 1 -->\n"
        "  <units name=\"fahrenheitish\">\n"
        "    <!-- THIS COMMENT SHOULD BE IGNORED 2 -->\n"
        "    <unit units=\"kelvin\"><!-- THIS COMMENT SHOULD BE IGNORED 2a --></unit>\n"
        "  </units>\n"
        "  <component name=\"main\">\n"
        "    <!-- THIS COMMENT SHOULD BE IGNORED 3 -->\n"
        "    <variable name=\"stan\" units=\"dimensionless\"/>\n"
        "    <variable name=\"V_k\" units=\"dimensionless\"><!-- THIS COMMENT SHOULD BE IGNORED 3a --></variable>\n"
        "    <reset variable=\"V_k\" order=\"2\" id=\"rid\" test_variable=\"stan\">\n"
        "      <!-- THIS COMMENT SHOULD BE IGNORED 4 -->\n"
        "      <test_value>\n"
        "        <!-- THIS COMMENT SHOULD BE IGNORED 5 -->\n"
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "          <apply />\n"
        "        </math>\n"
        "      </test_value>\n"
        "      <reset_value>\n"
        "        <!-- THIS COMMENT SHOULD BE IGNORED 6 -->\n"
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "          <apply />\n"
        "        </math>\n"
        "      </reset_value>\n"
        "    </reset>\n"
        "  </component>\n"
        "  <component name=\"child\"/>\n"
        "  <encapsulation>\n"
        "    <!-- THIS COMMENT SHOULD BE IGNORED 7 -->\n"
        "    <component_ref component=\"main\">\n"
        "       <!-- THIS COMMENT SHOULD BE IGNORED 8 -->\n"
        "       <component_ref component=\"child\"/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create();
    parser->parseModel(in);

    EXPECT_EQ(size_t(0), parser->issueCount());
}